

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_surface.cxx
# Opt level: O0

void __thiscall xray_re::xr_surface::xr_surface(xr_surface *this,bool skeletal)

{
  char *pcVar1;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [19];
  allocator<char> local_12;
  byte local_11;
  xr_surface *pxStack_10;
  bool skeletal_local;
  xr_surface *this_local;
  
  this->_vptr_xr_surface = (_func_int **)&PTR__xr_surface_0038e2a0;
  local_11 = skeletal;
  pxStack_10 = this;
  std::__cxx11::string::string((string *)&this->m_name);
  pcVar1 = "default";
  if ((local_11 & 1) != 0) {
    pcVar1 = "models\\model";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_eshader,pcVar1,&local_12);
  std::allocator<char>::~allocator(&local_12);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_cshader,"default",local_25);
  std::allocator<char>::~allocator(local_25);
  pcVar1 = "default";
  if ((local_11 & 1) != 0) {
    pcVar1 = "default_object";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_gamemtl,pcVar1,&local_26);
  std::allocator<char>::~allocator(&local_26);
  std::__cxx11::string::string((string *)&this->m_texture);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_vmap,"Texture",&local_27);
  std::allocator<char>::~allocator(&local_27);
  this->m_flags = 0;
  this->m_fvf = 0x112;
  return;
}

Assistant:

xr_surface::xr_surface(bool skeletal):
	m_eshader(skeletal ? "models\\model" : "default"),
	m_cshader("default"),
	m_gamemtl(skeletal ? "default_object" : "default"),
	m_vmap("Texture"),
	m_flags(0),
	m_fvf(ESURFACE_DEFAULT_FVF) {}